

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O3

Result __thiscall
ruckig::TargetCalculator<0UL,_MinimalDynamicDofsVector>::calculate<false>
          (TargetCalculator<0UL,_MinimalDynamicDofsVector> *this,
          InputParameter<0UL,_MinimalDynamicDofsVector> *inp,
          Trajectory<0UL,_MinimalDynamicDofsVector> *traj,double delta_time,bool *was_interrupted)

{
  ControlInterface CVar1;
  ControlSigns CVar2;
  pointer pMVar3;
  pointer pdVar4;
  _Map_pointer ppdVar5;
  size_t sVar6;
  _Elt_pointer pPVar7;
  _Elt_pointer pdVar8;
  _Map_pointer ppdVar9;
  char cVar10;
  bool bVar11;
  byte bVar12;
  ulong uVar13;
  _Elt_pointer pdVar14;
  __normal_iterator<ruckig::Synchronization_*,_std::vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>_>
  _Var15;
  double *pdVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ControlInterface *pCVar20;
  long lVar21;
  _Elt_pointer pbVar22;
  ulong uVar23;
  Synchronization *pSVar24;
  _Elt_pointer pbVar25;
  long lVar26;
  ulong uVar27;
  double *pdVar28;
  pointer pBVar29;
  double *pdVar30;
  double *pdVar31;
  long lVar32;
  _Elt_pointer pPVar33;
  Profile *pPVar34;
  _Elt_pointer pdVar35;
  _Elt_pointer pbVar36;
  ulong uVar37;
  double *pdVar38;
  Block *pBVar39;
  _Storage<unsigned_long,_true> _Var40;
  size_t sVar41;
  bool discrete_duration;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  optional<double> t_min;
  PositionFirstOrderStep1 step1;
  _Storage<unsigned_long,_true> local_e58;
  char local_e50;
  Profile local_e48 [6];
  
  *was_interrupted = false;
  Trajectory<0UL,_MinimalDynamicDofsVector>::resize<0UL,_0>(traj,0);
  uVar37 = this->degrees_of_freedom;
  if (uVar37 == 0) {
    discrete_duration = inp->duration_discretization == Discrete;
    bVar12 = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_engaged;
  }
  else {
    uVar23 = 0;
    do {
      pMVar3 = (traj->profiles).
               super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar33 = ((iterator *)
                ((long)&(pMVar3->data).
                        super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> + 0x10)
                )->_M_cur;
      lVar19 = ((long)pPVar33 -
                (long)*(_Elt_pointer *)
                       ((long)&(pMVar3->data).
                               super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                       + 0x18) >> 6) * -0x71c71c71c71c71c7 + uVar23;
      if (lVar19 == 0) {
        pBVar39 = (Block *)(pPVar33 + uVar23);
      }
      else {
        pBVar39 = (Block *)(*(_Map_pointer *)
                             ((long)&(pMVar3->data).
                                     super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                             + 0x28))[lVar19];
      }
      if ((inp->min_velocity).
          super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>._M_payload.
          super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>.
          super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>._M_engaged == true) {
        lVar19 = (long)((iterator *)
                       ((long)&(inp->min_velocity).
                               super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>
                               .super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>
                               ._M_payload._M_value.data + 0x10))->_M_cur;
        uVar13 = (lVar19 - (long)*(_Elt_pointer *)
                                  ((long)&(inp->min_velocity).
                                          super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>
                                          ._M_payload._M_value.data + 0x18) >> 3) + uVar23;
        if ((long)uVar13 < 0) {
          uVar17 = (long)uVar13 >> 6;
LAB_00110e89:
          pdVar38 = (*(_Map_pointer *)
                      ((long)&(inp->min_velocity).
                              super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>
                              .super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>.
                              _M_payload._M_value.data + 0x28))[uVar17] + uVar13 + uVar17 * -0x40;
        }
        else {
          if (0x3f < uVar13) {
            uVar17 = uVar13 >> 6;
            goto LAB_00110e89;
          }
          pdVar38 = (double *)(lVar19 + uVar23 * 8);
        }
        dVar42 = *pdVar38;
      }
      else {
        pdVar14 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar13 = ((long)pdVar14 -
                  (long)(inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
        if ((long)uVar13 < 0) {
          uVar17 = (long)uVar13 >> 6;
LAB_00110ea8:
          pdVar38 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar17] +
                    uVar13 + uVar17 * -0x40;
        }
        else {
          if (0x3f < uVar13) {
            uVar17 = uVar13 >> 6;
            goto LAB_00110ea8;
          }
          pdVar38 = pdVar14 + uVar23;
        }
        dVar42 = -*pdVar38;
      }
      pdVar4 = (this->inp_min_velocity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4[uVar23] = dVar42;
      if ((inp->min_acceleration).
          super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>._M_payload.
          super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>.
          super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>._M_engaged == true) {
        lVar19 = (long)((iterator *)
                       ((long)&(inp->min_acceleration).
                               super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>
                               .super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>
                               ._M_payload._M_value.data + 0x10))->_M_cur;
        uVar13 = (lVar19 - (long)*(_Elt_pointer *)
                                  ((long)&(inp->min_acceleration).
                                          super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>
                                          ._M_payload._M_value.data + 0x18) >> 3) + uVar23;
        if ((long)uVar13 < 0) {
          uVar17 = (long)uVar13 >> 6;
LAB_00110f4f:
          pdVar38 = (*(_Map_pointer *)
                      ((long)&(inp->min_acceleration).
                              super__Optional_base<MinimalDynamicDofsVector<double,_0UL>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<MinimalDynamicDofsVector<double,_0UL>,_true,_false,_false>
                              .super__Optional_payload_base<MinimalDynamicDofsVector<double,_0UL>_>.
                              _M_payload._M_value.data + 0x28))[uVar17] + uVar13 + uVar17 * -0x40;
        }
        else {
          if (0x3f < uVar13) {
            uVar17 = uVar13 >> 6;
            goto LAB_00110f4f;
          }
          pdVar38 = (double *)(lVar19 + uVar23 * 8);
        }
        dVar42 = *pdVar38;
      }
      else {
        pdVar14 = (inp->max_acceleration).data.super__Deque_base<double,_std::allocator<double>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar13 = ((long)pdVar14 -
                  (long)(inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
        if ((long)uVar13 < 0) {
          uVar17 = (long)uVar13 >> 6;
LAB_00110f6e:
          pdVar14 = (inp->max_acceleration).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar17] +
                    uVar13 + uVar17 * -0x40;
        }
        else {
          if (0x3f < uVar13) {
            uVar17 = uVar13 >> 6;
            goto LAB_00110f6e;
          }
          pdVar14 = pdVar14 + uVar23;
        }
        dVar42 = -*pdVar14;
      }
      (this->inp_min_acceleration).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar23] = dVar42;
      pCVar20 = &inp->control_interface;
      if ((inp->per_dof_control_interface).
          super__Optional_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_false,_false>
          ._M_payload.
          super__Optional_payload<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_true,_false,_false>
          .super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>_>.
          _M_engaged == true) {
        lVar19 = (long)((iterator *)
                       ((long)&(inp->per_dof_control_interface).
                               super__Optional_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_true,_false,_false>
                               .
                               super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>_>
                               ._M_payload._M_value.data + 0x10))->_M_cur;
        uVar13 = (lVar19 - (long)*(_Elt_pointer *)
                                  ((long)&(inp->per_dof_control_interface).
                                          super__Optional_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>_>
                                          ._M_payload._M_value.data + 0x18) >> 2) + uVar23;
        if ((long)uVar13 < 0) {
          uVar17 = (long)uVar13 >> 7;
        }
        else {
          if (uVar13 < 0x80) {
            pCVar20 = (ControlInterface *)(lVar19 + uVar23 * 4);
            goto LAB_00110ff6;
          }
          uVar17 = uVar13 >> 7;
        }
        pCVar20 = (*(_Map_pointer *)
                    ((long)&(inp->per_dof_control_interface).
                            super__Optional_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>,_true,_false,_false>
                            .
                            super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::ControlInterface,_0UL>_>
                            ._M_payload._M_value.data + 0x28))[uVar17] + uVar13 + uVar17 * -0x80;
      }
LAB_00110ff6:
      CVar1 = *pCVar20;
      (this->inp_per_dof_control_interface).
      super__Vector_base<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar23] = CVar1;
      pSVar24 = &inp->synchronization;
      if ((inp->per_dof_synchronization).
          super__Optional_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_false,_false>
          ._M_payload.
          super__Optional_payload<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_true,_false,_false>
          .super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>_>.
          _M_engaged == true) {
        lVar19 = (long)((iterator *)
                       ((long)&(inp->per_dof_synchronization).
                               super__Optional_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_true,_false,_false>
                               .
                               super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>_>
                               ._M_payload._M_value.data + 0x10))->_M_cur;
        uVar13 = (lVar19 - (long)*(_Elt_pointer *)
                                  ((long)&(inp->per_dof_synchronization).
                                          super__Optional_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>_>
                                          ._M_payload._M_value.data + 0x18) >> 2) + uVar23;
        if ((long)uVar13 < 0) {
          uVar17 = (long)uVar13 >> 7;
        }
        else {
          if (uVar13 < 0x80) {
            pSVar24 = (Synchronization *)(lVar19 + uVar23 * 4);
            goto LAB_00111060;
          }
          uVar17 = uVar13 >> 7;
        }
        pSVar24 = (*(_Map_pointer *)
                    ((long)&(inp->per_dof_synchronization).
                            super__Optional_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>,_true,_false,_false>
                            .
                            super__Optional_payload_base<MinimalDynamicDofsVector<ruckig::Synchronization,_0UL>_>
                            ._M_payload._M_value.data + 0x28))[uVar17] + uVar13 + uVar17 * -0x80;
      }
LAB_00111060:
      (this->inp_per_dof_synchronization).
      super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>._M_impl.
      super__Vector_impl_data._M_start[uVar23] = *pSVar24;
      pbVar36 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      pbVar25 = pbVar36 + (uVar23 - (long)(inp->enabled).data.
                                          super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                                          super__Deque_impl_data._M_start._M_first);
      if ((long)pbVar25 < 0) {
        uVar13 = (long)pbVar25 >> 9;
LAB_001110aa:
        pbVar36 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar13] +
                  (long)(pbVar25 + uVar13 * -0x200);
      }
      else {
        if ((_Elt_pointer)0x1ff < pbVar25) {
          uVar13 = (ulong)pbVar25 >> 9;
          goto LAB_001110aa;
        }
        pbVar36 = pbVar36 + uVar23;
      }
      if (*pbVar36 == false) {
        pdVar14 = (inp->current_position).data.super__Deque_base<double,_std::allocator<double>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar13 = ((long)pdVar14 -
                  (long)(inp->current_position).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
        if ((long)uVar13 < 0) {
          uVar17 = (long)uVar13 >> 6;
LAB_0011116e:
          pdVar14 = (inp->current_position).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar17] +
                    uVar13 + uVar17 * -0x40;
        }
        else {
          if (0x3f < uVar13) {
            uVar17 = uVar13 >> 6;
            goto LAB_0011116e;
          }
          pdVar14 = pdVar14 + uVar23;
        }
        (pBVar39->p_min).p._M_elems[7] = *pdVar14;
        pdVar14 = (inp->current_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar13 = ((long)pdVar14 -
                  (long)(inp->current_velocity).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
        if ((long)uVar13 < 0) {
          uVar17 = (long)uVar13 >> 6;
LAB_001111c7:
          pdVar14 = (inp->current_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar17] +
                    uVar13 + uVar17 * -0x40;
        }
        else {
          if (0x3f < uVar13) {
            uVar17 = uVar13 >> 6;
            goto LAB_001111c7;
          }
          pdVar14 = pdVar14 + uVar23;
        }
        (pBVar39->p_min).v._M_elems[7] = *pdVar14;
        pdVar14 = (inp->current_acceleration).data.
                  super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
                  _M_start._M_cur;
        uVar13 = ((long)pdVar14 -
                  (long)(inp->current_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
        if ((long)uVar13 < 0) {
          uVar17 = (long)uVar13 >> 6;
LAB_00111223:
          pdVar14 = (inp->current_acceleration).data.
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node[uVar17] + uVar13 + uVar17 * -0x40;
        }
        else {
          if (0x3f < uVar13) {
            uVar17 = uVar13 >> 6;
            goto LAB_00111223;
          }
          pdVar14 = pdVar14 + uVar23;
        }
        (pBVar39->p_min).a._M_elems[7] = *pdVar14;
        (pBVar39->p_min).t_sum._M_elems[6] = 0.0;
        pBVar29 = (this->blocks).super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pBVar29[uVar23].t_min = 0.0;
        if (*(bool *)((long)&pBVar29[uVar23].a.
                             super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload +
                     0x250) == true) {
          *(bool *)((long)&pBVar29[uVar23].a.
                           super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload +
                   0x250) = false;
        }
        if (*(bool *)((long)&pBVar29[uVar23].b.
                             super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload +
                     0x250) == true) {
          *(bool *)((long)&pBVar29[uVar23].b.
                           super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload +
                   0x250) = false;
        }
      }
      else {
        if (CVar1 == Velocity) {
          pdVar14 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          ppdVar5 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node;
          uVar13 = ((long)pdVar14 -
                    (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          uVar17 = (long)uVar13 >> 6;
          uVar37 = uVar17;
          if ((long)uVar13 < 0) {
LAB_00111355:
            pdVar35 = ppdVar5[uVar37] + uVar13 + uVar37 * -0x40;
          }
          else {
            if (0x3f < uVar13) {
              uVar37 = uVar13 >> 6;
              goto LAB_00111355;
            }
            pdVar35 = pdVar14 + uVar23;
          }
          if (ABS(*pdVar35) == INFINITY) {
            ruckig::BrakeProfile::get_second_order_velocity_brake_trajectory();
          }
          else {
            pdVar35 = (inp->current_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar37 = ((long)pdVar35 -
                      (long)(inp->current_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            if ((long)uVar37 < 0) {
              uVar27 = (long)uVar37 >> 6;
LAB_001115dd:
              pdVar38 = (inp->current_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
            }
            else {
              if (0x3f < uVar37) {
                uVar27 = uVar37 >> 6;
                goto LAB_001115dd;
              }
              pdVar38 = pdVar35 + uVar23;
            }
            pdVar35 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar37 = ((long)pdVar35 -
                      (long)(inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            if ((long)uVar37 < 0) {
              uVar27 = (long)uVar37 >> 6;
LAB_0011162c:
              pdVar28 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
            }
            else {
              if (0x3f < uVar37) {
                uVar27 = uVar37 >> 6;
                goto LAB_0011162c;
              }
              pdVar28 = pdVar35 + uVar23;
            }
            if ((long)uVar13 < 0) {
LAB_0011165f:
              pdVar31 = ppdVar5[uVar17] + uVar13 + uVar17 * -0x40;
            }
            else {
              if (0x3f < uVar13) {
                uVar17 = uVar13 >> 6;
                goto LAB_0011165f;
              }
              pdVar31 = pdVar14 + uVar23;
            }
            ruckig::BrakeProfile::get_velocity_brake_trajectory(*pdVar38,*pdVar28,dVar42,*pdVar31);
          }
          pdVar14 = (inp->current_position).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar14 -
                    (long)(inp->current_position).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar13 = (long)uVar37 >> 6;
LAB_001116bb:
            pdVar14 = (inp->current_position).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
          }
          else {
            if (0x3f < uVar37) {
              uVar13 = uVar37 >> 6;
              goto LAB_001116bb;
            }
            pdVar14 = pdVar14 + uVar23;
          }
          dVar42 = *pdVar14;
          pdVar14 = (inp->current_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar14 -
                    (long)(inp->current_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar13 = (long)uVar37 >> 6;
LAB_0011170b:
            pdVar14 = (inp->current_velocity).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
          }
          else {
            if (0x3f < uVar37) {
              uVar13 = uVar37 >> 6;
              goto LAB_0011170b;
            }
            pdVar14 = pdVar14 + uVar23;
          }
          dVar44 = *pdVar14;
          pdVar14 = (inp->current_acceleration).data.
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar14 -
                    (long)(inp->current_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar13 = (long)uVar37 >> 6;
LAB_0011175e:
            pdVar14 = (inp->current_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
          }
          else {
            if (0x3f < uVar37) {
              uVar13 = uVar37 >> 6;
              goto LAB_0011175e;
            }
            pdVar14 = pdVar14 + uVar23;
          }
          dVar43 = *pdVar14;
          pdVar14 = (inp->target_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar14 -
                    (long)(inp->target_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar13 = (long)uVar37 >> 6;
LAB_001117b1:
            pdVar14 = (inp->target_velocity).data.super__Deque_base<double,_std::allocator<double>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node[uVar13] +
                      uVar37 + uVar13 * -0x40;
          }
          else {
            if (0x3f < uVar37) {
              uVar13 = uVar37 >> 6;
              goto LAB_001117b1;
            }
            pdVar14 = pdVar14 + uVar23;
          }
          dVar45 = *pdVar14;
          pdVar14 = (inp->target_acceleration).data.
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar14 -
                    (long)(inp->target_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar13 = (long)uVar37 >> 6;
LAB_00111804:
            pdVar14 = (inp->target_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
          }
          else {
            if (0x3f < uVar37) {
              uVar13 = uVar37 >> 6;
              goto LAB_00111804;
            }
            pdVar14 = pdVar14 + uVar23;
          }
          dVar46 = *pdVar14;
          lVar19 = 0x220;
          lVar18 = 0x228;
          lVar21 = 0x128;
          lVar26 = 0xe8;
          lVar32 = 0xa8;
LAB_00111b07:
          *(double *)((long)(pBVar39->p_min).t._M_elems + lVar32) = dVar43;
          *(double *)((long)(pBVar39->p_min).t._M_elems + lVar26) = dVar44;
          *(double *)((long)(pBVar39->p_min).t._M_elems + lVar21) = dVar42;
          *(double *)((long)(pBVar39->p_min).t._M_elems + lVar18) = dVar46;
          *(double *)((long)(pBVar39->p_min).t._M_elems + lVar19) = dVar45;
        }
        else if (CVar1 == Position) {
          pdVar14 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          ppdVar5 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node;
          uVar17 = ((long)pdVar14 -
                    (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          uVar13 = (long)uVar17 >> 6;
          uVar37 = uVar13;
          if ((long)uVar17 < 0) {
LAB_001112a8:
            pdVar35 = ppdVar5[uVar37] + uVar17 + uVar37 * -0x40;
          }
          else {
            if (0x3f < uVar17) {
              uVar37 = uVar17 >> 6;
              goto LAB_001112a8;
            }
            pdVar35 = pdVar14 + uVar23;
          }
          if (ABS(*pdVar35) == INFINITY) {
            pdVar14 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            ppdVar5 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node;
            uVar13 = ((long)pdVar14 -
                      (long)(inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            uVar17 = (long)uVar13 >> 6;
            uVar37 = uVar17;
            if ((long)uVar13 < 0) {
LAB_001113f6:
              pdVar35 = ppdVar5[uVar37] + uVar13 + uVar37 * -0x40;
            }
            else {
              if (0x3f < uVar13) {
                uVar37 = uVar13 >> 6;
                goto LAB_001113f6;
              }
              pdVar35 = pdVar14 + uVar23;
            }
            if (ABS(*pdVar35) != INFINITY) {
              pdVar35 = (inp->current_velocity).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              uVar37 = ((long)pdVar35 -
                        (long)(inp->current_velocity).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
              if ((long)uVar37 < 0) {
                uVar27 = (long)uVar37 >> 6;
LAB_00111848:
                pdVar38 = (inp->current_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
              }
              else {
                if (0x3f < uVar37) {
                  uVar27 = uVar37 >> 6;
                  goto LAB_00111848;
                }
                pdVar38 = pdVar35 + uVar23;
              }
              pdVar35 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
              uVar37 = ((long)pdVar35 -
                        (long)(inp->max_velocity).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
              if ((long)uVar37 < 0) {
                uVar27 = (long)uVar37 >> 6;
LAB_00111897:
                pdVar28 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
              }
              else {
                if (0x3f < uVar37) {
                  uVar27 = uVar37 >> 6;
                  goto LAB_00111897;
                }
                pdVar28 = pdVar35 + uVar23;
              }
              if ((long)uVar13 < 0) {
LAB_001118ca:
                pdVar31 = ppdVar5[uVar17] + uVar13 + uVar17 * -0x40;
              }
              else {
                if (0x3f < uVar13) {
                  uVar17 = uVar13 >> 6;
                  goto LAB_001118ca;
                }
                pdVar31 = pdVar14 + uVar23;
              }
              ruckig::BrakeProfile::get_second_order_position_brake_trajectory
                        (*pdVar38,*pdVar28,pdVar4[uVar23],*pdVar31,dVar42);
            }
          }
          else {
            pdVar35 = (inp->current_velocity).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar37 = ((long)pdVar35 -
                      (long)(inp->current_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            if ((long)uVar37 < 0) {
              uVar27 = (long)uVar37 >> 6;
LAB_0011146a:
              pdVar38 = (inp->current_velocity).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
            }
            else {
              if (0x3f < uVar37) {
                uVar27 = uVar37 >> 6;
                goto LAB_0011146a;
              }
              pdVar38 = pdVar35 + uVar23;
            }
            pdVar35 = (inp->current_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar37 = ((long)pdVar35 -
                      (long)(inp->current_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            if ((long)uVar37 < 0) {
              uVar27 = (long)uVar37 >> 6;
LAB_001114b9:
              pdVar28 = (inp->current_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
            }
            else {
              if (0x3f < uVar37) {
                uVar27 = uVar37 >> 6;
                goto LAB_001114b9;
              }
              pdVar28 = pdVar35 + uVar23;
            }
            pdVar35 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_cur;
            uVar37 = ((long)pdVar35 -
                      (long)(inp->max_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            if ((long)uVar37 < 0) {
              uVar27 = (long)uVar37 >> 6;
LAB_0011150b:
              pdVar31 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_node[uVar27] +
                        uVar37 + uVar27 * -0x40;
            }
            else {
              if (0x3f < uVar37) {
                uVar27 = uVar37 >> 6;
                goto LAB_0011150b;
              }
              pdVar31 = pdVar35 + uVar23;
            }
            pdVar35 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar37 = ((long)pdVar35 -
                      (long)(inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            if ((long)uVar37 < 0) {
              uVar27 = (long)uVar37 >> 6;
LAB_00111578:
              pdVar30 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
            }
            else {
              if (0x3f < uVar37) {
                uVar27 = uVar37 >> 6;
                goto LAB_00111578;
              }
              pdVar30 = pdVar35 + uVar23;
            }
            if ((long)uVar17 < 0) {
LAB_001115af:
              pdVar16 = ppdVar5[uVar13] + uVar17 + uVar13 * -0x40;
            }
            else {
              if (0x3f < uVar17) {
                uVar13 = uVar17 >> 6;
                goto LAB_001115af;
              }
              pdVar16 = pdVar14 + uVar23;
            }
            ruckig::BrakeProfile::get_position_brake_trajectory
                      (*pdVar38,*pdVar28,*pdVar31,pdVar4[uVar23],*pdVar30,dVar42,*pdVar16);
          }
          pdVar14 = (inp->current_position).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar14 -
                    (long)(inp->current_position).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar13 = (long)uVar37 >> 6;
LAB_00111933:
            pdVar38 = (inp->current_position).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
          }
          else {
            if (0x3f < uVar37) {
              uVar13 = uVar37 >> 6;
              goto LAB_00111933;
            }
            pdVar38 = pdVar14 + uVar23;
          }
          dVar44 = *pdVar38;
          pdVar14 = (inp->current_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar14 -
                    (long)(inp->current_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar13 = (long)uVar37 >> 6;
LAB_00111983:
            pdVar38 = (inp->current_velocity).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
          }
          else {
            if (0x3f < uVar37) {
              uVar13 = uVar37 >> 6;
              goto LAB_00111983;
            }
            pdVar38 = pdVar14 + uVar23;
          }
          dVar43 = *pdVar38;
          pdVar14 = (inp->current_acceleration).data.
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar14 -
                    (long)(inp->current_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar13 = (long)uVar37 >> 6;
LAB_001119d6:
            pdVar14 = (inp->current_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
          }
          else {
            if (0x3f < uVar37) {
              uVar13 = uVar37 >> 6;
              goto LAB_001119d6;
            }
            pdVar14 = pdVar14 + uVar23;
          }
          pdVar35 = (inp->target_position).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar35 -
                    (long)(inp->target_position).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar13 = (long)uVar37 >> 6;
LAB_00111a29:
            pdVar38 = (inp->target_position).data.super__Deque_base<double,_std::allocator<double>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node[uVar13] +
                      uVar37 + uVar13 * -0x40;
          }
          else {
            if (0x3f < uVar37) {
              uVar13 = uVar37 >> 6;
              goto LAB_00111a29;
            }
            pdVar38 = pdVar35 + uVar23;
          }
          dVar45 = *pdVar38;
          pdVar35 = (inp->target_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar35 -
                    (long)(inp->target_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar13 = (long)uVar37 >> 6;
LAB_00111a7c:
            pdVar38 = (inp->target_velocity).data.super__Deque_base<double,_std::allocator<double>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node[uVar13] +
                      uVar37 + uVar13 * -0x40;
          }
          else {
            if (0x3f < uVar37) {
              uVar13 = uVar37 >> 6;
              goto LAB_00111a7c;
            }
            pdVar38 = pdVar35 + uVar23;
          }
          dVar46 = *pdVar38;
          pdVar35 = (inp->target_acceleration).data.
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar35 -
                    (long)(inp->target_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar13 = (long)uVar37 >> 6;
LAB_00111acf:
            pdVar38 = (inp->target_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
          }
          else {
            if (0x3f < uVar37) {
              uVar13 = uVar37 >> 6;
              goto LAB_00111acf;
            }
            pdVar38 = pdVar35 + uVar23;
          }
          dVar42 = *pdVar38;
          (pBVar39->p_min).a._M_elems[0] = *pdVar14;
          lVar19 = 0x218;
          lVar18 = 0x220;
          lVar21 = 0x228;
          lVar26 = 0x128;
          lVar32 = 0xe8;
          goto LAB_00111b07;
        }
        pdVar14 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
        uVar37 = ((long)pdVar14 -
                  (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
        if ((long)uVar37 < 0) {
          uVar13 = (long)uVar37 >> 6;
LAB_00111b67:
          pdVar14 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
        }
        else {
          if (0x3f < uVar37) {
            uVar13 = uVar37 >> 6;
            goto LAB_00111b67;
          }
          pdVar14 = pdVar14 + uVar23;
        }
        if (ABS(*pdVar14) == INFINITY) {
          pdVar14 = (inp->max_acceleration).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar14 -
                    (long)(inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar13 = (long)uVar37 >> 6;
LAB_00111bf8:
            pdVar14 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
          }
          else {
            if (0x3f < uVar37) {
              uVar13 = uVar37 >> 6;
              goto LAB_00111bf8;
            }
            pdVar14 = pdVar14 + uVar23;
          }
          if (ABS(*pdVar14) != INFINITY) {
            BrakeProfile::finalize_second_order
                      (&(pBVar39->p_min).brake,(pBVar39->p_min).p._M_elems,
                       (pBVar39->p_min).v._M_elems,(pBVar39->p_min).a._M_elems);
          }
        }
        else {
          BrakeProfile::finalize
                    (&(pBVar39->p_min).brake,(pBVar39->p_min).p._M_elems,(pBVar39->p_min).v._M_elems
                     ,(pBVar39->p_min).a._M_elems);
        }
        CVar1 = (this->inp_per_dof_control_interface).
                super__Vector_base<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar23];
        if (CVar1 != Velocity) {
          if (CVar1 == Position) {
            pdVar14 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_cur;
            ppdVar5 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node;
            uVar13 = ((long)pdVar14 -
                      (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            uVar17 = (long)uVar13 >> 6;
            uVar37 = uVar17;
            if ((long)uVar13 < 0) {
LAB_00111d8c:
              pdVar35 = ppdVar5[uVar37] + uVar13 + uVar37 * -0x40;
            }
            else {
              if (0x3f < uVar13) {
                uVar37 = uVar13 >> 6;
                goto LAB_00111d8c;
              }
              pdVar35 = pdVar14 + uVar23;
            }
            if (ABS(*pdVar35) == INFINITY) {
              pdVar14 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              ppdVar5 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node;
              uVar13 = ((long)pdVar14 -
                        (long)(inp->max_acceleration).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
              uVar17 = (long)uVar13 >> 6;
              uVar37 = uVar17;
              if ((long)uVar13 < 0) {
LAB_00111f84:
                pdVar35 = ppdVar5[uVar37] + uVar13 + uVar37 * -0x40;
              }
              else {
                if (0x3f < uVar13) {
                  uVar37 = uVar13 >> 6;
                  goto LAB_00111f84;
                }
                pdVar35 = pdVar14 + uVar23;
              }
              if (ABS(*pdVar35) == INFINITY) {
                pdVar14 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                uVar37 = ((long)pdVar14 -
                          (long)(inp->max_velocity).data.
                                super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
                if ((long)uVar37 < 0) {
                  uVar13 = (long)uVar37 >> 6;
LAB_00112186:
                  pdVar38 = (inp->max_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar13] +
                            uVar37 + uVar13 * -0x40;
                }
                else {
                  if (0x3f < uVar37) {
                    uVar13 = uVar37 >> 6;
                    goto LAB_00112186;
                  }
                  pdVar38 = pdVar14 + uVar23;
                }
                ruckig::PositionFirstOrderStep1::PositionFirstOrderStep1
                          ((PositionFirstOrderStep1 *)local_e48,(pBVar39->p_min).p._M_elems[0],
                           (pBVar39->p_min).pf,*pdVar38,
                           (this->inp_min_velocity).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar23]);
                cVar10 = ruckig::PositionFirstOrderStep1::get_profile(local_e48,pBVar39);
              }
              else {
                pdVar35 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                uVar37 = ((long)pdVar35 -
                          (long)(inp->max_velocity).data.
                                super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
                if ((long)uVar37 < 0) {
                  uVar27 = (long)uVar37 >> 6;
LAB_001121f4:
                  pdVar38 = (inp->max_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar27] +
                            uVar37 + uVar27 * -0x40;
                }
                else {
                  if (0x3f < uVar37) {
                    uVar27 = uVar37 >> 6;
                    goto LAB_001121f4;
                  }
                  pdVar38 = pdVar35 + uVar23;
                }
                if ((long)uVar13 < 0) {
LAB_0011222a:
                  pdVar28 = ppdVar5[uVar17] + uVar13 + uVar17 * -0x40;
                }
                else {
                  if (0x3f < uVar13) {
                    uVar17 = uVar13 >> 6;
                    goto LAB_0011222a;
                  }
                  pdVar28 = pdVar14 + uVar23;
                }
                ruckig::PositionSecondOrderStep1::PositionSecondOrderStep1
                          ((PositionSecondOrderStep1 *)local_e48,(pBVar39->p_min).p._M_elems[0],
                           (pBVar39->p_min).v._M_elems[0],(pBVar39->p_min).pf,(pBVar39->p_min).vf,
                           *pdVar38,(this->inp_min_velocity).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar23],*pdVar28,
                           (this->inp_min_acceleration).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar23]);
                cVar10 = ruckig::PositionSecondOrderStep1::get_profile(local_e48,pBVar39);
              }
            }
            else {
              pdVar35 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
              uVar37 = ((long)pdVar35 -
                        (long)(inp->max_velocity).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
              if ((long)uVar37 < 0) {
                uVar27 = (long)uVar37 >> 6;
LAB_00112032:
                pdVar38 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
              }
              else {
                if (0x3f < uVar37) {
                  uVar27 = uVar37 >> 6;
                  goto LAB_00112032;
                }
                pdVar38 = pdVar35 + uVar23;
              }
              pdVar35 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              uVar37 = ((long)pdVar35 -
                        (long)(inp->max_acceleration).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
              if ((long)uVar37 < 0) {
                uVar27 = (long)uVar37 >> 6;
LAB_00112081:
                pdVar28 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
              }
              else {
                if (0x3f < uVar37) {
                  uVar27 = uVar37 >> 6;
                  goto LAB_00112081;
                }
                pdVar28 = pdVar35 + uVar23;
              }
              if ((long)uVar13 < 0) {
LAB_001120b7:
                pdVar31 = ppdVar5[uVar17] + uVar13 + uVar17 * -0x40;
              }
              else {
                if (0x3f < uVar13) {
                  uVar17 = uVar13 >> 6;
                  goto LAB_001120b7;
                }
                pdVar31 = pdVar14 + uVar23;
              }
              ruckig::PositionThirdOrderStep1::PositionThirdOrderStep1
                        ((PositionThirdOrderStep1 *)local_e48,(pBVar39->p_min).p._M_elems[0],
                         (pBVar39->p_min).v._M_elems[0],(pBVar39->p_min).a._M_elems[0],
                         (pBVar39->p_min).pf,(pBVar39->p_min).vf,(pBVar39->p_min).af,*pdVar38,
                         (this->inp_min_velocity).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar23],*pdVar28,
                         (this->inp_min_acceleration).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar23],*pdVar31);
              cVar10 = ruckig::PositionThirdOrderStep1::get_profile(local_e48,pBVar39);
            }
            goto LAB_001122ae;
          }
LAB_00112626:
          pdVar14 = (inp->max_acceleration).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar14 -
                    (long)(inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar13 = (long)uVar37 >> 6;
LAB_00112725:
            pdVar38 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
          }
          else {
            if (0x3f < uVar37) {
              uVar13 = uVar37 >> 6;
              goto LAB_00112725;
            }
            pdVar38 = pdVar14 + uVar23;
          }
          if ((*pdVar38 == 0.0) && (!NAN(*pdVar38))) {
            return ErrorZeroLimits;
          }
          dVar42 = (this->inp_min_acceleration).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar23];
          if ((dVar42 == 0.0) && (!NAN(dVar42))) {
            return ErrorZeroLimits;
          }
          pdVar14 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar14 -
                    (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar23 = (long)uVar37 >> 6;
          }
          else {
            if (uVar37 < 0x40) {
              pdVar38 = pdVar14 + uVar23;
              goto LAB_0011284c;
            }
            uVar23 = uVar37 >> 6;
          }
          pdVar38 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node[uVar23] + uVar37 + uVar23 * -0x40;
LAB_0011284c:
          if ((*pdVar38 == 0.0) && (!NAN(*pdVar38))) {
            return ErrorZeroLimits;
          }
          return ErrorExecutionTimeCalculation;
        }
        pdVar14 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
        ppdVar5 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node;
        uVar13 = ((long)pdVar14 -
                  (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
        uVar17 = (long)uVar13 >> 6;
        uVar37 = uVar17;
        if ((long)uVar13 < 0) {
LAB_00111cde:
          pdVar35 = ppdVar5[uVar37] + uVar13 + uVar37 * -0x40;
        }
        else {
          if (0x3f < uVar13) {
            uVar37 = uVar13 >> 6;
            goto LAB_00111cde;
          }
          pdVar35 = pdVar14 + uVar23;
        }
        if (ABS(*pdVar35) == INFINITY) {
          pdVar14 = (inp->max_acceleration).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar14 -
                    (long)(inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar13 = (long)uVar37 >> 6;
LAB_00111e5c:
            pdVar38 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
          }
          else {
            if (0x3f < uVar37) {
              uVar13 = uVar37 >> 6;
              goto LAB_00111e5c;
            }
            pdVar38 = pdVar14 + uVar23;
          }
          ruckig::VelocitySecondOrderStep1::VelocitySecondOrderStep1
                    ((VelocitySecondOrderStep1 *)local_e48,(pBVar39->p_min).v._M_elems[0],
                     (pBVar39->p_min).vf,*pdVar38,
                     (this->inp_min_acceleration).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar23]);
          cVar10 = ruckig::VelocitySecondOrderStep1::get_profile(local_e48,pBVar39);
        }
        else {
          pdVar35 = (inp->max_acceleration).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar37 = ((long)pdVar35 -
                    (long)(inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
          if ((long)uVar37 < 0) {
            uVar27 = (long)uVar37 >> 6;
LAB_00111eca:
            pdVar38 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
          }
          else {
            if (0x3f < uVar37) {
              uVar27 = uVar37 >> 6;
              goto LAB_00111eca;
            }
            pdVar38 = pdVar35 + uVar23;
          }
          if ((long)uVar13 < 0) {
LAB_00111f00:
            pdVar28 = ppdVar5[uVar17] + uVar13 + uVar17 * -0x40;
          }
          else {
            if (0x3f < uVar13) {
              uVar17 = uVar13 >> 6;
              goto LAB_00111f00;
            }
            pdVar28 = pdVar14 + uVar23;
          }
          ruckig::VelocityThirdOrderStep1::VelocityThirdOrderStep1
                    ((VelocityThirdOrderStep1 *)local_e48,(pBVar39->p_min).v._M_elems[0],
                     (pBVar39->p_min).a._M_elems[0],(pBVar39->p_min).vf,(pBVar39->p_min).af,*pdVar38
                     ,(this->inp_min_acceleration).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar23],*pdVar28);
          cVar10 = ruckig::VelocityThirdOrderStep1::get_profile(local_e48,pBVar39);
        }
LAB_001122ae:
        if (cVar10 == '\0') goto LAB_00112626;
        pdVar14 = (traj->independent_min_durations).data.
                  super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
                  _M_start._M_cur;
        uVar37 = ((long)pdVar14 -
                  (long)(traj->independent_min_durations).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
        if ((long)uVar37 < 0) {
          uVar13 = (long)uVar37 >> 6;
LAB_001122fc:
          pdVar14 = (traj->independent_min_durations).data.
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
        }
        else {
          if (0x3f < uVar37) {
            uVar13 = uVar37 >> 6;
            goto LAB_001122fc;
          }
          pdVar14 = pdVar14 + uVar23;
        }
        *pdVar14 = (this->blocks).super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar23].t_min;
        uVar37 = this->degrees_of_freedom;
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < uVar37);
    discrete_duration = inp->duration_discretization == Discrete;
    bVar12 = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_engaged;
    if ((uVar37 == 1 && (bVar12 & 1) == 0) && !discrete_duration) {
      pBVar29 = (this->blocks).super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>.
                _M_impl.super__Vector_impl_data._M_start;
      traj->duration = pBVar29->t_min;
      pMVar3 = (traj->profiles).
               super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar33 = ((iterator *)
                ((long)&(pMVar3->data).
                        super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> + 0x10)
                )->_M_cur;
      lVar19 = (long)pPVar33 -
               (long)*(_Elt_pointer *)
                      ((long)&(pMVar3->data).
                              super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> +
                      0x18);
      if (lVar19 != 0) {
        pPVar33 = *(_Elt_pointer *)
                   ((long)*(_Map_pointer *)
                           ((long)&(pMVar3->data).
                                   super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                           + 0x28) + (lVar19 >> 3) * -0x71c71c71c71c71c7);
      }
      memcpy(pPVar33,pBVar29,0x23c);
      *(traj->cumulative_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = traj->duration;
      return Working;
    }
  }
  local_e50 = '\0';
  pdVar38 = &traj->duration;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = (bool)bVar12;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_payload;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _9_7_ = 0;
  bVar11 = synchronize(this,t_min,pdVar38,(optional<unsigned_long> *)&local_e58,
                       (traj->profiles).
                       super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,discrete_duration,delta_time);
  sVar6 = this->degrees_of_freedom;
  if (!bVar11) {
    if (sVar6 != 0) {
      pdVar14 = (inp->max_acceleration).data.super__Deque_base<double,_std::allocator<double>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      lVar18 = (long)pdVar14 -
               (long)(inp->max_acceleration).data.super__Deque_base<double,_std::allocator<double>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first;
      lVar21 = lVar18 >> 3;
      pdVar35 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      lVar26 = (long)pdVar35 -
               (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>._M_impl
                     .super__Deque_impl_data._M_start._M_first;
      lVar19 = lVar26 >> 3;
      sVar41 = 0;
      do {
        uVar37 = lVar21 + sVar41;
        if ((long)uVar37 < 0) {
          uVar37 = (long)uVar37 >> 6;
LAB_00112597:
          pdVar38 = (double *)
                    ((long)(inp->max_acceleration).data.
                           super__Deque_base<double,_std::allocator<double>_>._M_impl.
                           super__Deque_impl_data._M_start._M_node[uVar37] +
                    lVar18 + uVar37 * -0x200);
        }
        else {
          if (0x3f < uVar37) {
            uVar37 = uVar37 >> 6;
            goto LAB_00112597;
          }
          pdVar38 = pdVar14 + sVar41;
        }
        if ((*pdVar38 == 0.0) && (!NAN(*pdVar38))) {
          return ErrorZeroLimits;
        }
        dVar42 = (this->inp_min_acceleration).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[sVar41];
        if ((dVar42 == 0.0) && (!NAN(dVar42))) {
          return ErrorZeroLimits;
        }
        uVar37 = lVar19 + sVar41;
        if ((long)uVar37 < 0) {
          uVar37 = (long)uVar37 >> 6;
LAB_001125e7:
          pdVar38 = (double *)
                    ((long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                           _M_impl.super__Deque_impl_data._M_start._M_node[uVar37] +
                    lVar26 + uVar37 * -0x200);
        }
        else {
          if (0x3f < uVar37) {
            uVar37 = uVar37 >> 6;
            goto LAB_001125e7;
          }
          pdVar38 = pdVar35 + sVar41;
        }
        if ((*pdVar38 == 0.0) && (!NAN(*pdVar38))) {
          return ErrorZeroLimits;
        }
        sVar41 = sVar41 + 1;
        lVar18 = lVar18 + 8;
        lVar26 = lVar26 + 8;
      } while (sVar6 != sVar41);
    }
    return ErrorSynchronizationCalculation;
  }
  if (sVar6 == 0) {
    bVar11 = true;
  }
  else {
    lVar18 = 0;
    lVar19 = 0;
    _Var40._M_value = 0;
    do {
      pbVar36 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      pbVar25 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_start._M_first;
      pbVar22 = pbVar36 + (_Var40._M_value - (long)pbVar25);
      if ((long)pbVar22 < 0) {
        uVar37 = (long)pbVar22 >> 9;
LAB_00112455:
        pbVar36 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar37] +
                  (long)(pbVar36 + (uVar37 * -0x200 - (long)pbVar25));
      }
      else if ((_Elt_pointer)0x1ff < pbVar22) {
        uVar37 = (ulong)pbVar22 >> 9;
        goto LAB_00112455;
      }
      if ((pbVar36[_Var40._M_value] == true) &&
         ((this->inp_per_dof_synchronization).
          super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>.
          _M_impl.super__Vector_impl_data._M_start[_Var40._M_value] == None)) {
        pMVar3 = (traj->profiles).
                 super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar33 = ((iterator *)
                  ((long)&(pMVar3->data).
                          super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> +
                  0x10))->_M_cur;
        lVar21 = ((long)pPVar33 -
                  (long)*(_Elt_pointer *)
                         ((long)&(pMVar3->data).
                                 super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                         + 0x18) >> 6) * -0x71c71c71c71c71c7 + _Var40._M_value;
        if (lVar21 == 0) {
          pPVar34 = (Profile *)((long)&pPVar33->t + lVar19);
        }
        else {
          pPVar34 = (*(_Map_pointer *)
                      ((long)&(pMVar3->data).
                              super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> +
                      0x28))[lVar21];
        }
        memcpy(pPVar34,(void *)((long)(((this->blocks).
                                        super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->p_min).t.
                                      _M_elems + lVar18),0x23c);
        dVar42 = *(double *)
                  ((long)&((this->blocks).
                           super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>._M_impl
                           .super__Vector_impl_data._M_start)->t_min + lVar18);
        if (*pdVar38 <= dVar42 && dVar42 != *pdVar38) {
          *pdVar38 = dVar42;
          local_e50 = '\x01';
          local_e58 = _Var40;
        }
      }
      _Var40._M_value = _Var40._M_value + 1;
      lVar19 = lVar19 + 0x240;
      lVar18 = lVar18 + 0x6f8;
    } while (_Var40._M_value < this->degrees_of_freedom);
    bVar11 = this->degrees_of_freedom == 0;
  }
  dVar42 = traj->duration;
  *(traj->cumulative_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
   super__Vector_impl_data._M_start = dVar42;
  if (7600.0 < dVar42) {
    return ErrorTrajectoryDuration;
  }
  if ((dVar42 == 0.0) && (!NAN(dVar42))) {
    if (bVar11) {
      return Working;
    }
    lVar18 = 0;
    lVar19 = 0;
    uVar37 = 0;
    do {
      pMVar3 = (traj->profiles).
               super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar33 = ((iterator *)
                ((long)&(pMVar3->data).
                        super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> + 0x10)
                )->_M_cur;
      lVar21 = ((long)pPVar33 -
                (long)*(_Elt_pointer *)
                       ((long)&(pMVar3->data).
                               super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                       + 0x18) >> 6) * -0x71c71c71c71c71c7 + uVar37;
      if (lVar21 == 0) {
        pPVar34 = (Profile *)((long)&pPVar33->t + lVar18);
      }
      else {
        pPVar34 = (*(_Map_pointer *)
                    ((long)&(pMVar3->data).
                            super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> +
                    0x28))[lVar21];
      }
      memcpy(pPVar34,(void *)((long)(((this->blocks).
                                      super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->p_min).t._M_elems
                             + lVar19),0x23c);
      uVar37 = uVar37 + 1;
      lVar19 = lVar19 + 0x6f8;
      lVar18 = lVar18 + 0x240;
    } while (uVar37 < this->degrees_of_freedom);
    return Working;
  }
  if ((discrete_duration == false) &&
     (pSVar24 = (this->inp_per_dof_synchronization).
                super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                ._M_impl.super__Vector_impl_data._M_finish,
     _Var15 = std::
              __find_if<__gnu_cxx::__normal_iterator<ruckig::Synchronization*,std::vector<ruckig::Synchronization,std::allocator<ruckig::Synchronization>>>,__gnu_cxx::__ops::_Iter_negate<ruckig::TargetCalculator<0ul,MinimalDynamicDofsVector>::calculate<false>(ruckig::InputParameter<0ul,MinimalDynamicDofsVector>const&,ruckig::Trajectory<0ul,MinimalDynamicDofsVector>&,double,bool&)::_lambda(ruckig::Synchronization)_1_>>
                        ((this->inp_per_dof_synchronization).
                         super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                         ._M_impl.super__Vector_impl_data._M_start,pSVar24),
     _Var15._M_current == pSVar24)) {
    return Working;
  }
  if ((local_e50 == '\x01') &&
     (pSVar24 = (this->inp_per_dof_synchronization).
                super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                ._M_impl.super__Vector_impl_data._M_finish,
     _Var15 = std::
              __find_if<__gnu_cxx::__normal_iterator<ruckig::Synchronization*,std::vector<ruckig::Synchronization,std::allocator<ruckig::Synchronization>>>,__gnu_cxx::__ops::_Iter_pred<ruckig::TargetCalculator<0ul,MinimalDynamicDofsVector>::calculate<false>(ruckig::InputParameter<0ul,MinimalDynamicDofsVector>const&,ruckig::Trajectory<0ul,MinimalDynamicDofsVector>&,double,bool&)::_lambda(ruckig::Synchronization)_2_>>
                        ((this->inp_per_dof_synchronization).
                         super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                         ._M_impl.super__Vector_impl_data._M_start,pSVar24),
     _Var15._M_current != pSVar24)) {
    if (local_e50 == '\0') {
      std::__throw_bad_optional_access();
    }
    pMVar3 = (traj->profiles).
             super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar33 = ((iterator *)
              ((long)&(pMVar3->data).
                      super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> + 0x10))
              ->_M_cur;
    lVar19 = ((long)pPVar33 -
              (long)*(_Elt_pointer *)
                     ((long)&(pMVar3->data).
                             super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> +
                     0x18) >> 6) * -0x71c71c71c71c71c7 + local_e58._M_value;
    if (lVar19 == 0) {
      pPVar33 = pPVar33 + (long)local_e58;
    }
    else {
      pPVar33 = (*(_Map_pointer *)
                  ((long)&(pMVar3->data).
                          super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> +
                  0x28))[lVar19];
    }
    bVar11 = is_input_collinear(this,inp,pPVar33->direction,local_e58._M_value);
    if (!bVar11) goto LAB_0011385f;
    if (this->degrees_of_freedom == 0) {
LAB_001141ae:
      pSVar24 = (this->inp_per_dof_synchronization).
                super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      _Var15 = std::
               __find_if<__gnu_cxx::__normal_iterator<ruckig::Synchronization*,std::vector<ruckig::Synchronization,std::allocator<ruckig::Synchronization>>>,__gnu_cxx::__ops::_Iter_negate<ruckig::TargetCalculator<0ul,MinimalDynamicDofsVector>::calculate<false>(ruckig::InputParameter<0ul,MinimalDynamicDofsVector>const&,ruckig::Trajectory<0ul,MinimalDynamicDofsVector>&,double,bool&)::_lambda(ruckig::Synchronization)_3_>>
                         ((this->inp_per_dof_synchronization).
                          super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>
                          ._M_impl.super__Vector_impl_data._M_start,pSVar24);
      if (_Var15._M_current == pSVar24) {
        return Working;
      }
      if (this->degrees_of_freedom == 0) {
        return Working;
      }
      goto LAB_0011386f;
    }
    bVar12 = 1;
    uVar23 = 0;
    do {
      pbVar36 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      pbVar25 = pbVar36 + (uVar23 - (long)(inp->enabled).data.
                                          super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                                          super__Deque_impl_data._M_start._M_first);
      if ((long)pbVar25 < 0) {
        uVar37 = (long)pbVar25 >> 9;
LAB_00112912:
        pbVar36 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar37] +
                  (long)(pbVar25 + uVar37 * -0x200);
      }
      else {
        if ((_Elt_pointer)0x1ff < pbVar25) {
          uVar37 = (ulong)pbVar25 >> 9;
          goto LAB_00112912;
        }
        pbVar36 = pbVar36 + uVar23;
      }
      if ((*pbVar36 == true) &&
         (((local_e50 != '\x01' || (uVar23 != local_e58._M_value)) &&
          ((this->inp_per_dof_synchronization).
           super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar23] == Phase)))) {
        pMVar3 = (traj->profiles).
                 super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar7 = ((iterator *)
                 ((long)&(pMVar3->data).
                         super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> + 0x10
                 ))->_M_cur;
        lVar19 = ((long)pPVar7 -
                  (long)*(_Elt_pointer *)
                         ((long)&(pMVar3->data).
                                 super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                         + 0x18) >> 6) * -0x71c71c71c71c71c7 + uVar23;
        if (lVar19 == 0) {
          pPVar34 = pPVar7 + uVar23;
        }
        else {
          pPVar34 = (*(_Map_pointer *)
                      ((long)&(pMVar3->data).
                              super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> +
                      0x28))[lVar19];
        }
        (pPVar34->t)._M_elems[6] = *(double *)((long)(pPVar33->t)._M_elems + 0x30);
        dVar42 = (pPVar33->t)._M_elems[0];
        dVar44 = *(double *)((long)(pPVar33->t)._M_elems + 8);
        dVar43 = *(double *)((long)(pPVar33->t)._M_elems + 0x10);
        dVar45 = *(double *)((long)(pPVar33->t)._M_elems + 0x18);
        dVar46 = *(double *)((long)(pPVar33->t)._M_elems + 0x28);
        (pPVar34->t)._M_elems[4] = *(double *)((long)(pPVar33->t)._M_elems + 0x20);
        (pPVar34->t)._M_elems[5] = dVar46;
        (pPVar34->t)._M_elems[2] = dVar43;
        (pPVar34->t)._M_elems[3] = dVar45;
        (pPVar34->t)._M_elems[0] = dVar42;
        (pPVar34->t)._M_elems[1] = dVar44;
        CVar2 = pPVar33->control_signs;
        pPVar34->control_signs = CVar2;
        CVar1 = (this->inp_per_dof_control_interface).
                super__Vector_base<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar23];
        if (CVar1 == Velocity) {
          if (CVar2 == UDUD) {
            pdVar14 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_cur;
            ppdVar5 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node;
            uVar17 = ((long)pdVar14 -
                      (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            uVar13 = (long)uVar17 >> 6;
            uVar37 = uVar13;
            if ((long)uVar17 < 0) {
LAB_00112ce9:
              pdVar35 = ppdVar5[uVar37] + uVar17 + uVar37 * -0x40;
            }
            else {
              if (0x3f < uVar17) {
                uVar37 = uVar17 >> 6;
                goto LAB_00112ce9;
              }
              pdVar35 = pdVar14 + uVar23;
            }
            pdVar8 = (this->new_phase_control).data.
                     super__Deque_base<double,_std::allocator<double>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur;
            ppdVar9 = (this->new_phase_control).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node;
            uVar37 = ((long)pdVar8 -
                      (long)(this->new_phase_control).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            uVar27 = (long)uVar37 >> 6;
            if (ABS(*pdVar35) != INFINITY) {
              if ((long)uVar37 < 0) {
LAB_00113478:
                pdVar28 = ppdVar9[uVar27] + uVar37 + uVar27 * -0x40;
              }
              else {
                if (0x3f < uVar37) {
                  uVar27 = uVar37 >> 6;
                  goto LAB_00113478;
                }
                pdVar28 = pdVar8 + uVar23;
              }
              pdVar35 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              uVar37 = ((long)pdVar35 -
                        (long)(inp->max_acceleration).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
              if ((long)uVar37 < 0) {
                uVar27 = (long)uVar37 >> 6;
LAB_0011352d:
                pdVar31 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
              }
              else {
                if (0x3f < uVar37) {
                  uVar27 = uVar37 >> 6;
                  goto LAB_0011352d;
                }
                pdVar31 = pdVar35 + uVar23;
              }
              if ((long)uVar17 < 0) {
LAB_00113565:
                pdVar30 = ppdVar5[uVar13] + uVar17 + uVar13 * -0x40;
              }
              else {
                if (0x3f < uVar17) {
                  uVar13 = uVar17 >> 6;
                  goto LAB_00113565;
                }
                pdVar30 = pdVar14 + uVar23;
              }
              if (ABS(*pdVar28) < ABS(*pdVar30) + 1e-12) {
                bVar11 = Profile::
                         check_for_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                   (pPVar34,*pdVar28,*pdVar31,
                                    (this->inp_min_acceleration).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar23]);
                goto LAB_001135dd;
              }
              goto LAB_001135d6;
            }
            if ((long)uVar37 < 0) {
LAB_00113429:
              pdVar28 = ppdVar9[uVar27] + uVar37 + uVar27 * -0x40;
            }
            else {
              if (0x3f < uVar37) {
                uVar27 = uVar37 >> 6;
                goto LAB_00113429;
              }
              pdVar28 = pdVar8 + uVar23;
            }
            pdVar14 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar37 = ((long)pdVar14 -
                      (long)(inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            if ((long)uVar37 < 0) {
              uVar13 = (long)uVar37 >> 6;
LAB_001134cf:
              pdVar31 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
            }
            else {
              if (0x3f < uVar37) {
                uVar13 = uVar37 >> 6;
                goto LAB_001134cf;
              }
              pdVar31 = pdVar14 + uVar23;
            }
            dVar42 = *pdVar28;
            bVar11 = false;
            if ((dVar42 < *pdVar31 + 1e-12) &&
               ((this->inp_min_acceleration).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar23] + -1e-12 < dVar42)) {
              bVar11 = Profile::
                       check_for_second_order_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                 (pPVar34,dVar42);
            }
          }
          else {
            if (CVar2 != UDDU) goto LAB_00113733;
            pdVar14 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_cur;
            ppdVar5 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node;
            uVar17 = ((long)pdVar14 -
                      (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            uVar13 = (long)uVar17 >> 6;
            uVar37 = uVar13;
            if ((long)uVar17 < 0) {
LAB_00112bc5:
              pdVar35 = ppdVar5[uVar37] + uVar17 + uVar37 * -0x40;
            }
            else {
              if (0x3f < uVar17) {
                uVar37 = uVar17 >> 6;
                goto LAB_00112bc5;
              }
              pdVar35 = pdVar14 + uVar23;
            }
            pdVar8 = (this->new_phase_control).data.
                     super__Deque_base<double,_std::allocator<double>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur;
            ppdVar9 = (this->new_phase_control).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node;
            uVar37 = ((long)pdVar8 -
                      (long)(this->new_phase_control).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            uVar27 = (long)uVar37 >> 6;
            if (ABS(*pdVar35) != INFINITY) {
              if ((long)uVar37 < 0) {
LAB_0011300b:
                pdVar28 = ppdVar9[uVar27] + uVar37 + uVar27 * -0x40;
              }
              else {
                if (0x3f < uVar37) {
                  uVar27 = uVar37 >> 6;
                  goto LAB_0011300b;
                }
                pdVar28 = pdVar8 + uVar23;
              }
              pdVar35 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              uVar37 = ((long)pdVar35 -
                        (long)(inp->max_acceleration).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
              if ((long)uVar37 < 0) {
                uVar27 = (long)uVar37 >> 6;
LAB_00113184:
                pdVar31 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
              }
              else {
                if (0x3f < uVar37) {
                  uVar27 = uVar37 >> 6;
                  goto LAB_00113184;
                }
                pdVar31 = pdVar35 + uVar23;
              }
              if ((long)uVar17 < 0) {
LAB_00113278:
                pdVar30 = ppdVar5[uVar13] + uVar17 + uVar13 * -0x40;
              }
              else {
                if (0x3f < uVar17) {
                  uVar13 = uVar17 >> 6;
                  goto LAB_00113278;
                }
                pdVar30 = pdVar14 + uVar23;
              }
              if (ABS(*pdVar28) < ABS(*pdVar30) + 1e-12) {
                bVar11 = Profile::
                         check_for_velocity<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                   (pPVar34,*pdVar28,*pdVar31,
                                    (this->inp_min_acceleration).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar23]);
                goto LAB_001135dd;
              }
LAB_001135d6:
              bVar11 = false;
              goto LAB_001135dd;
            }
            if ((long)uVar37 < 0) {
LAB_00112fb2:
              pdVar28 = ppdVar9[uVar27] + uVar37 + uVar27 * -0x40;
            }
            else {
              if (0x3f < uVar37) {
                uVar27 = uVar37 >> 6;
                goto LAB_00112fb2;
              }
              pdVar28 = pdVar8 + uVar23;
            }
            pdVar14 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar37 = ((long)pdVar14 -
                      (long)(inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            if ((long)uVar37 < 0) {
              uVar13 = (long)uVar37 >> 6;
LAB_00113126:
              pdVar31 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
            }
            else {
              if (0x3f < uVar37) {
                uVar13 = uVar37 >> 6;
                goto LAB_00113126;
              }
              pdVar31 = pdVar14 + uVar23;
            }
            dVar42 = *pdVar28;
            bVar11 = false;
            if ((dVar42 < *pdVar31 + 1e-12) &&
               ((this->inp_min_acceleration).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar23] + -1e-12 < dVar42)) {
              bVar11 = Profile::
                       check_for_second_order_velocity<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                 (pPVar34,dVar42);
            }
          }
LAB_0011372d:
          bVar12 = bVar11 & bVar12;
        }
        else if (CVar1 == Position) {
          if (CVar2 == UDUD) {
            pdVar14 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_cur;
            ppdVar5 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node;
            uVar13 = ((long)pdVar14 -
                      (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            uVar17 = (long)uVar13 >> 6;
            uVar37 = uVar17;
            if ((long)uVar13 < 0) {
LAB_00112c57:
              pdVar35 = ppdVar5[uVar37] + uVar13 + uVar37 * -0x40;
            }
            else {
              if (0x3f < uVar13) {
                uVar37 = uVar13 >> 6;
                goto LAB_00112c57;
              }
              pdVar35 = pdVar14 + uVar23;
            }
            pdVar8 = (this->new_phase_control).data.
                     super__Deque_base<double,_std::allocator<double>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur;
            ppdVar9 = (this->new_phase_control).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node;
            uVar27 = ((long)pdVar8 -
                      (long)(this->new_phase_control).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            uVar37 = (long)uVar27 >> 6;
            if (ABS(*pdVar35) != INFINITY) {
              if ((long)uVar27 < 0) {
LAB_001130c8:
                pdVar28 = ppdVar9[uVar37] + uVar27 + uVar37 * -0x40;
              }
              else {
                if (0x3f < uVar27) {
                  uVar37 = uVar27 >> 6;
                  goto LAB_001130c8;
                }
                pdVar28 = pdVar8 + uVar23;
              }
              pdVar35 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
              uVar37 = ((long)pdVar35 -
                        (long)(inp->max_velocity).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
              if ((long)uVar37 < 0) {
                uVar27 = (long)uVar37 >> 6;
LAB_0011321f:
                pdVar31 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
              }
              else {
                if (0x3f < uVar37) {
                  uVar27 = uVar37 >> 6;
                  goto LAB_0011321f;
                }
                pdVar31 = pdVar35 + uVar23;
              }
              pdVar35 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              uVar37 = ((long)pdVar35 -
                        (long)(inp->max_acceleration).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
              if ((long)uVar37 < 0) {
                uVar27 = (long)uVar37 >> 6;
LAB_00113361:
                pdVar30 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
              }
              else {
                if (0x3f < uVar37) {
                  uVar27 = uVar37 >> 6;
                  goto LAB_00113361;
                }
                pdVar30 = pdVar35 + uVar23;
              }
              if ((long)uVar13 < 0) {
LAB_001133be:
                pdVar16 = ppdVar5[uVar17] + uVar13 + uVar17 * -0x40;
              }
              else {
                if (0x3f < uVar13) {
                  uVar17 = uVar13 >> 6;
                  goto LAB_001133be;
                }
                pdVar16 = pdVar14 + uVar23;
              }
              if (ABS(*pdVar28) < ABS(*pdVar16) + 1e-12) {
                bVar11 = Profile::
                         check<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7,false>
                                   (pPVar34,*pdVar28,*pdVar31,
                                    (this->inp_min_velocity).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar23],*pdVar30,
                                    (this->inp_min_acceleration).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar23]);
                goto LAB_001135dd;
              }
              goto LAB_00113411;
            }
            if ((long)uVar27 < 0) {
LAB_00113069:
              pdVar28 = ppdVar9[uVar37];
              pdVar31 = pdVar28 + ((uint)uVar27 & 0x3f);
              pdVar28 = pdVar28 + uVar27 + uVar37 * -0x40;
            }
            else {
              if (0x3f < uVar27) {
                uVar37 = uVar27 >> 6;
                goto LAB_00113069;
              }
              pdVar28 = pdVar8 + uVar23;
              pdVar31 = pdVar28;
            }
            pdVar14 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_cur;
            uVar37 = ((long)pdVar14 -
                      (long)(inp->max_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            if ((long)uVar37 < 0) {
              uVar13 = (long)uVar37 >> 6;
LAB_001131c6:
              pdVar30 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_node[uVar13] +
                        uVar37 + uVar13 * -0x40;
            }
            else {
              if (0x3f < uVar37) {
                uVar13 = uVar37 >> 6;
                goto LAB_001131c6;
              }
              pdVar30 = pdVar14 + uVar23;
            }
            pdVar14 = (inp->max_acceleration).data.
                      super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar37 = ((long)pdVar14 -
                      (long)(inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            if ((long)uVar37 < 0) {
              uVar13 = (long)uVar37 >> 6;
LAB_001132d3:
              pdVar16 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node[uVar13] + uVar37 + uVar13 * -0x40;
            }
            else {
              if (0x3f < uVar37) {
                uVar13 = uVar37 >> 6;
                goto LAB_001132d3;
              }
              pdVar16 = pdVar14 + uVar23;
            }
            dVar42 = *pdVar31;
            dVar44 = (this->inp_min_acceleration).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar23] + -1e-12;
            if (dVar42 <= dVar44) goto LAB_00113858;
            dVar43 = -*pdVar28;
            bVar11 = false;
            if (((dVar43 < *pdVar16 + 1e-12) && (dVar44 < dVar43)) && (dVar42 < *pdVar16 + 1e-12)) {
              bVar11 = Profile::
                       check_for_second_order<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                 (pPVar34,dVar42,dVar43,*pdVar30,
                                  (this->inp_min_velocity).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar23]);
            }
          }
          else {
            if (CVar2 != UDDU) goto LAB_00113733;
            pdVar14 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_cur;
            ppdVar5 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node;
            uVar13 = ((long)pdVar14 -
                      (long)(inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
            uVar17 = (long)uVar13 >> 6;
            uVar37 = uVar17;
            if ((long)uVar13 < 0) {
LAB_00112b1e:
              pdVar35 = ppdVar5[uVar37] + uVar13 + uVar37 * -0x40;
            }
            else {
              if (0x3f < uVar13) {
                uVar37 = uVar13 >> 6;
                goto LAB_00112b1e;
              }
              pdVar35 = pdVar14 + uVar23;
            }
            if (ABS(*pdVar35) == INFINITY) {
              pdVar14 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              ppdVar5 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node;
              uVar13 = ((long)pdVar14 -
                        (long)(inp->max_acceleration).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
              uVar17 = (long)uVar13 >> 6;
              uVar37 = uVar17;
              if ((long)uVar13 < 0) {
LAB_00112ddf:
                pdVar35 = ppdVar5[uVar37] + uVar13 + uVar37 * -0x40;
              }
              else {
                if (0x3f < uVar13) {
                  uVar37 = uVar13 >> 6;
                  goto LAB_00112ddf;
                }
                pdVar35 = pdVar14 + uVar23;
              }
              pdVar8 = (this->new_phase_control).data.
                       super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur;
              ppdVar9 = (this->new_phase_control).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node;
              uVar27 = ((long)pdVar8 -
                        (long)(this->new_phase_control).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
              uVar37 = (long)uVar27 >> 6;
              if (ABS(*pdVar35) == INFINITY) {
                if ((long)uVar27 < 0) {
LAB_001135fe:
                  pdVar28 = ppdVar9[uVar37] + uVar27 + uVar37 * -0x40;
                }
                else {
                  if (0x3f < uVar27) {
                    uVar37 = uVar27 >> 6;
                    goto LAB_001135fe;
                  }
                  pdVar28 = pdVar8 + uVar23;
                }
                pdVar14 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                uVar37 = ((long)pdVar14 -
                          (long)(inp->max_velocity).data.
                                super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
                if ((long)uVar37 < 0) {
                  uVar13 = (long)uVar37 >> 6;
LAB_001136ba:
                  pdVar31 = (inp->max_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node[uVar13] +
                            uVar37 + uVar13 * -0x40;
                }
                else {
                  if (0x3f < uVar37) {
                    uVar13 = uVar37 >> 6;
                    goto LAB_001136ba;
                  }
                  pdVar31 = pdVar14 + uVar23;
                }
                dVar42 = *pdVar28;
                bVar11 = false;
                if ((dVar42 < *pdVar31 + 1e-12) &&
                   (bVar11 = false,
                   (this->inp_min_velocity).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar23] + -1e-12 < dVar42)) {
                  bVar11 = Profile::
                           check_for_first_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                     (pPVar34,dVar42);
                }
                goto LAB_0011372d;
              }
              if ((long)uVar27 < 0) {
LAB_00113650:
                pdVar28 = ppdVar9[uVar37];
                pdVar31 = pdVar28 + ((uint)uVar27 & 0x3f);
                pdVar28 = pdVar28 + uVar27 + uVar37 * -0x40;
              }
              else {
                if (0x3f < uVar27) {
                  uVar37 = uVar27 >> 6;
                  goto LAB_00113650;
                }
                pdVar28 = pdVar8 + uVar23;
                pdVar31 = pdVar28;
              }
              pdVar35 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
              uVar37 = ((long)pdVar35 -
                        (long)(inp->max_velocity).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
              if ((long)uVar37 < 0) {
                uVar27 = (long)uVar37 >> 6;
LAB_0011376a:
                pdVar30 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
              }
              else {
                if (0x3f < uVar37) {
                  uVar27 = uVar37 >> 6;
                  goto LAB_0011376a;
                }
                pdVar30 = pdVar35 + uVar23;
              }
              if ((long)uVar13 < 0) {
LAB_001137ab:
                pdVar16 = ppdVar5[uVar17] + uVar13 + uVar17 * -0x40;
              }
              else {
                if (0x3f < uVar13) {
                  uVar17 = uVar13 >> 6;
                  goto LAB_001137ab;
                }
                pdVar16 = pdVar14 + uVar23;
              }
              dVar42 = *pdVar31;
              dVar44 = (this->inp_min_acceleration).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar23] + -1e-12;
              if (dVar44 < dVar42) {
                dVar43 = -*pdVar28;
                bVar11 = false;
                if (((dVar43 < *pdVar16 + 1e-12) && (dVar44 < dVar43)) &&
                   (dVar42 < *pdVar16 + 1e-12)) {
                  bVar11 = Profile::
                           check_for_second_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                     (pPVar34,dVar42,dVar43,*pdVar30,
                                      (this->inp_min_velocity).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start[uVar23]);
                }
                goto LAB_001135dd;
              }
LAB_00113858:
              bVar11 = false;
            }
            else {
              pdVar35 = (this->new_phase_control).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              uVar37 = ((long)pdVar35 -
                        (long)(this->new_phase_control).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
              if ((long)uVar37 < 0) {
                uVar27 = (long)uVar37 >> 6;
LAB_00112e70:
                pdVar28 = (this->new_phase_control).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
              }
              else {
                if (0x3f < uVar37) {
                  uVar27 = uVar37 >> 6;
                  goto LAB_00112e70;
                }
                pdVar28 = pdVar35 + uVar23;
              }
              pdVar35 = (inp->max_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_cur;
              uVar37 = ((long)pdVar35 -
                        (long)(inp->max_velocity).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
              if ((long)uVar37 < 0) {
                uVar27 = (long)uVar37 >> 6;
LAB_00112ec4:
                pdVar31 = (inp->max_velocity).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
              }
              else {
                if (0x3f < uVar37) {
                  uVar27 = uVar37 >> 6;
                  goto LAB_00112ec4;
                }
                pdVar31 = pdVar35 + uVar23;
              }
              pdVar35 = (inp->max_acceleration).data.
                        super__Deque_base<double,_std::allocator<double>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              uVar37 = ((long)pdVar35 -
                        (long)(inp->max_acceleration).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_first >> 3) + uVar23;
              if ((long)uVar37 < 0) {
                uVar27 = (long)uVar37 >> 6;
LAB_00112f13:
                pdVar30 = (inp->max_acceleration).data.
                          super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar27] + uVar37 + uVar27 * -0x40;
              }
              else {
                if (0x3f < uVar37) {
                  uVar27 = uVar37 >> 6;
                  goto LAB_00112f13;
                }
                pdVar30 = pdVar35 + uVar23;
              }
              if ((long)uVar13 < 0) {
LAB_00112f6b:
                pdVar16 = ppdVar5[uVar17] + uVar13 + uVar17 * -0x40;
              }
              else {
                if (0x3f < uVar13) {
                  uVar17 = uVar13 >> 6;
                  goto LAB_00112f6b;
                }
                pdVar16 = pdVar14 + uVar23;
              }
              if (ABS(*pdVar28) < ABS(*pdVar16) + 1e-12) {
                bVar11 = Profile::
                         check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7,false>
                                   (pPVar34,*pdVar28,*pdVar31,
                                    (this->inp_min_velocity).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar23],*pdVar30,
                                    (this->inp_min_acceleration).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar23]);
                goto LAB_001135dd;
              }
LAB_00113411:
              bVar11 = false;
            }
          }
LAB_001135dd:
          bVar12 = bVar12 & bVar11;
        }
LAB_00113733:
        pPVar34->limits = pPVar33->limits;
      }
      uVar23 = uVar23 + 1;
      uVar37 = this->degrees_of_freedom;
    } while (uVar23 < uVar37);
    if (bVar12 != 0) goto LAB_001141ae;
  }
  else {
LAB_0011385f:
    uVar37 = this->degrees_of_freedom;
  }
  if (uVar37 == 0) {
    return Working;
  }
LAB_0011386f:
  lVar18 = 0;
  lVar19 = 0;
  lVar21 = 0;
  uVar37 = 0;
  do {
    if (((local_e50 == '\x01') && (uVar37 == local_e58._M_value)) ||
       (bVar11 = true,
       (this->inp_per_dof_synchronization).
       super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>._M_impl
       .super__Vector_impl_data._M_start[uVar37] == None)) {
      bVar11 = discrete_duration;
    }
    pbVar36 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    pbVar25 = pbVar36 + (uVar37 - (long)(inp->enabled).data.
                                        super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                                        super__Deque_impl_data._M_start._M_first);
    if ((long)pbVar25 < 0) {
      uVar23 = (long)pbVar25 >> 9;
LAB_001138e2:
      pbVar36 = (inp->enabled).data.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_start._M_node[uVar23] + (long)(pbVar25 + uVar23 * -0x200);
    }
    else {
      if ((_Elt_pointer)0x1ff < pbVar25) {
        uVar23 = (ulong)pbVar25 >> 9;
        goto LAB_001138e2;
      }
      pbVar36 = pbVar36 + uVar37;
    }
    if ((bVar11 & *pbVar36) == 1) {
      pMVar3 = (traj->profiles).
               super__Vector_base<MinimalDynamicDofsVector<ruckig::Profile,_0UL>,_std::allocator<MinimalDynamicDofsVector<ruckig::Profile,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar33 = ((iterator *)
                ((long)&(pMVar3->data).
                        super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> + 0x10)
                )->_M_cur;
      lVar26 = ((long)pPVar33 -
                (long)*(_Elt_pointer *)
                       ((long)&(pMVar3->data).
                               super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_>
                       + 0x18) >> 6) * -0x71c71c71c71c71c7 + uVar37;
      if (lVar26 == 0) {
        pPVar34 = (Profile *)((long)&pPVar33->t + lVar18);
      }
      else {
        pPVar34 = (*(_Map_pointer *)
                    ((long)&(pMVar3->data).
                            super__Deque_base<ruckig::Profile,_std::allocator<ruckig::Profile>_> +
                    0x28))[lVar26];
      }
      dVar42 = (*pdVar38 - (pPVar34->brake).duration) - (pPVar34->accel).duration;
      if ((this->inp_per_dof_synchronization).
          super__Vector_base<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar37] == TimeIfNecessary) {
        pdVar14 = (inp->target_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar26 = (long)pdVar14 -
                 (long)(inp->target_velocity).data.
                       super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_start._M_first >> 3;
        uVar23 = uVar37 + lVar26;
        if ((long)uVar23 < 0) {
          uVar23 = (long)uVar23 >> 6;
LAB_0011399a:
          pdVar28 = (inp->target_velocity).data.super__Deque_base<double,_std::allocator<double>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar23] +
                    lVar26 + uVar23 * -0x40 + uVar37;
        }
        else {
          if (0x3f < uVar23) {
            uVar23 = uVar23 >> 6;
            goto LAB_0011399a;
          }
          pdVar28 = (double *)((long)pdVar14 + lVar21);
        }
        if (2.220446049250313e-16 <= ABS(*pdVar28)) goto LAB_00113a42;
        pdVar14 = (inp->target_acceleration).data.super__Deque_base<double,_std::allocator<double>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
        lVar26 = (long)pdVar14 -
                 (long)(inp->target_acceleration).data.
                       super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_start._M_first >> 3;
        uVar23 = uVar37 + lVar26;
        if ((long)uVar23 < 0) {
          uVar23 = (long)uVar23 >> 6;
LAB_00113a01:
          pdVar28 = (inp->target_acceleration).data.
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node[uVar23] +
                    lVar26 + uVar23 * -0x40 + uVar37;
        }
        else {
          if (0x3f < uVar23) {
            uVar23 = uVar23 >> 6;
            goto LAB_00113a01;
          }
          pdVar28 = (double *)((long)pdVar14 + lVar21);
        }
        if (2.220446049250313e-16 <= ABS(*pdVar28)) goto LAB_00113a42;
        pBVar29 = (this->blocks).super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar37;
      }
      else {
LAB_00113a42:
        pBVar29 = (this->blocks).super__Vector_base<ruckig::Block,_std::allocator<ruckig::Block>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (4.440892098500626e-16 <= ABS(dVar42 - *(double *)((long)&pBVar29->t_min + lVar19))) {
          if ((*(char *)((long)&(pBVar29->a).
                                super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload
                        + lVar19 + 0x250) != '\x01') ||
             (4.440892098500626e-16 <=
              ABS(dVar42 - *(double *)
                            ((long)&(pBVar29->a).
                                    super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                    _M_payload + lVar19 + 8)))) {
            if ((*(char *)((long)&(pBVar29->b).
                                  super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                  _M_payload + lVar19 + 0x250) != '\x01') ||
               (4.440892098500626e-16 <=
                ABS(dVar42 - *(double *)
                              ((long)&(pBVar29->b).
                                      super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                      _M_payload + lVar19 + 8)))) {
              CVar1 = (this->inp_per_dof_control_interface).
                      super__Vector_base<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar37];
              if (CVar1 == Velocity) {
                pdVar14 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_cur;
                ppdVar5 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_node;
                lVar26 = (long)pdVar14 -
                         (long)(inp->max_jerk).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar13 = uVar37 + lVar26;
                uVar17 = (long)uVar13 >> 6;
                uVar23 = uVar17;
                if ((long)uVar13 < 0) {
LAB_00113bb0:
                  pdVar28 = ppdVar5[uVar23] + lVar26 + uVar23 * -0x40 + uVar37;
                }
                else {
                  if (0x3f < uVar13) {
                    uVar23 = uVar13 >> 6;
                    goto LAB_00113bb0;
                  }
                  pdVar28 = (double *)((long)pdVar14 + lVar21);
                }
                if (ABS(*pdVar28) == INFINITY) {
                  pdVar14 = (inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_cur;
                  lVar26 = (long)pdVar14 -
                           (long)(inp->max_acceleration).data.
                                 super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                 super__Deque_impl_data._M_start._M_first >> 3;
                  uVar23 = uVar37 + lVar26;
                  if ((long)uVar23 < 0) {
                    uVar23 = (long)uVar23 >> 6;
LAB_00113d3c:
                    pdVar28 = (inp->max_acceleration).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_node[uVar23] +
                              lVar26 + uVar23 * -0x40 + uVar37;
                  }
                  else {
                    if (0x3f < uVar23) {
                      uVar23 = uVar23 >> 6;
                      goto LAB_00113d3c;
                    }
                    pdVar28 = (double *)((long)pdVar14 + lVar21);
                  }
                  ruckig::VelocitySecondOrderStep2::VelocitySecondOrderStep2
                            ((VelocitySecondOrderStep2 *)local_e48,dVar42,(pPVar34->v)._M_elems[0],
                             pPVar34->vf,*pdVar28,
                             (this->inp_min_acceleration).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar37]);
                  cVar10 = ruckig::VelocitySecondOrderStep2::get_profile(local_e48);
                }
                else {
                  pdVar35 = (inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_cur;
                  lVar32 = (long)pdVar35 -
                           (long)(inp->max_acceleration).data.
                                 super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                 super__Deque_impl_data._M_start._M_first >> 3;
                  uVar23 = uVar37 + lVar32;
                  if ((long)uVar23 < 0) {
                    uVar23 = (long)uVar23 >> 6;
LAB_00113d96:
                    pdVar28 = (inp->max_acceleration).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_node[uVar23] +
                              lVar32 + uVar23 * -0x40 + uVar37;
                  }
                  else {
                    if (0x3f < uVar23) {
                      uVar23 = uVar23 >> 6;
                      goto LAB_00113d96;
                    }
                    pdVar28 = (double *)((long)pdVar35 + lVar21);
                  }
                  if ((long)uVar13 < 0) {
LAB_00113dd5:
                    pdVar31 = ppdVar5[uVar17] + lVar26 + uVar17 * -0x40 + uVar37;
                  }
                  else {
                    if (0x3f < uVar13) {
                      uVar17 = uVar13 >> 6;
                      goto LAB_00113dd5;
                    }
                    pdVar31 = (double *)((long)pdVar14 + lVar21);
                  }
                  ruckig::VelocityThirdOrderStep2::VelocityThirdOrderStep2
                            ((VelocityThirdOrderStep2 *)local_e48,dVar42,(pPVar34->v)._M_elems[0],
                             (pPVar34->a)._M_elems[0],pPVar34->vf,pPVar34->af,*pdVar28,
                             (this->inp_min_acceleration).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar37],*pdVar31);
                  cVar10 = ruckig::VelocityThirdOrderStep2::get_profile(local_e48);
                }
              }
              else {
                if (CVar1 != Position) {
                  return ErrorSynchronizationCalculation;
                }
                pdVar14 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_cur;
                ppdVar5 = (inp->max_jerk).data.super__Deque_base<double,_std::allocator<double>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_node;
                lVar26 = (long)pdVar14 -
                         (long)(inp->max_jerk).data.
                               super__Deque_base<double,_std::allocator<double>_>._M_impl.
                               super__Deque_impl_data._M_start._M_first >> 3;
                uVar13 = uVar37 + lVar26;
                uVar17 = (long)uVar13 >> 6;
                uVar23 = uVar17;
                if ((long)uVar13 < 0) {
LAB_00113c70:
                  pdVar28 = ppdVar5[uVar23] + lVar26 + uVar23 * -0x40 + uVar37;
                }
                else {
                  if (0x3f < uVar13) {
                    uVar23 = uVar13 >> 6;
                    goto LAB_00113c70;
                  }
                  pdVar28 = (double *)((long)pdVar14 + lVar21);
                }
                if (ABS(*pdVar28) == INFINITY) {
                  pdVar14 = (inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_cur;
                  ppdVar5 = (inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node;
                  lVar26 = (long)pdVar14 -
                           (long)(inp->max_acceleration).data.
                                 super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                 super__Deque_impl_data._M_start._M_first >> 3;
                  uVar13 = uVar37 + lVar26;
                  uVar17 = (long)uVar13 >> 6;
                  uVar23 = uVar17;
                  if ((long)uVar13 < 0) {
LAB_00113e48:
                    pdVar28 = ppdVar5[uVar23] + lVar26 + uVar23 * -0x40 + uVar37;
                  }
                  else {
                    if (0x3f < uVar13) {
                      uVar23 = uVar13 >> 6;
                      goto LAB_00113e48;
                    }
                    pdVar28 = (double *)((long)pdVar14 + lVar21);
                  }
                  if (ABS(*pdVar28) == INFINITY) {
                    pdVar14 = (inp->max_velocity).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_cur;
                    lVar26 = (long)pdVar14 -
                             (long)(inp->max_velocity).data.
                                   super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                   super__Deque_impl_data._M_start._M_first >> 3;
                    uVar23 = uVar37 + lVar26;
                    if ((long)uVar23 < 0) {
                      uVar23 = (long)uVar23 >> 6;
LAB_00114050:
                      pdVar28 = (inp->max_velocity).data.
                                super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                super__Deque_impl_data._M_start._M_node[uVar23] +
                                lVar26 + uVar23 * -0x40 + uVar37;
                    }
                    else {
                      if (0x3f < uVar23) {
                        uVar23 = uVar23 >> 6;
                        goto LAB_00114050;
                      }
                      pdVar28 = (double *)((long)pdVar14 + lVar21);
                    }
                    ruckig::PositionFirstOrderStep2::PositionFirstOrderStep2
                              ((PositionFirstOrderStep2 *)local_e48,dVar42,(pPVar34->p)._M_elems[0],
                               pPVar34->pf,*pdVar28,
                               (this->inp_min_velocity).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar37]);
                    cVar10 = ruckig::PositionFirstOrderStep2::get_profile(local_e48);
                  }
                  else {
                    pdVar35 = (inp->max_velocity).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_cur;
                    lVar32 = (long)pdVar35 -
                             (long)(inp->max_velocity).data.
                                   super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                   super__Deque_impl_data._M_start._M_first >> 3;
                    uVar23 = uVar37 + lVar32;
                    if ((long)uVar23 < 0) {
                      uVar23 = (long)uVar23 >> 6;
LAB_001140aa:
                      pdVar28 = (inp->max_velocity).data.
                                super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                super__Deque_impl_data._M_start._M_node[uVar23] +
                                lVar32 + uVar23 * -0x40 + uVar37;
                    }
                    else {
                      if (0x3f < uVar23) {
                        uVar23 = uVar23 >> 6;
                        goto LAB_001140aa;
                      }
                      pdVar28 = (double *)((long)pdVar35 + lVar21);
                    }
                    if ((long)uVar13 < 0) {
LAB_001140e9:
                      pdVar31 = ppdVar5[uVar17] + lVar26 + uVar17 * -0x40 + uVar37;
                    }
                    else {
                      if (0x3f < uVar13) {
                        uVar17 = uVar13 >> 6;
                        goto LAB_001140e9;
                      }
                      pdVar31 = (double *)((long)pdVar14 + lVar21);
                    }
                    ruckig::PositionSecondOrderStep2::PositionSecondOrderStep2
                              ((PositionSecondOrderStep2 *)local_e48,dVar42,(pPVar34->p)._M_elems[0]
                               ,(pPVar34->v)._M_elems[0],pPVar34->pf,pPVar34->vf,*pdVar28,
                               (this->inp_min_velocity).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar37],*pdVar31,
                               (this->inp_min_acceleration).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar37]);
                    cVar10 = ruckig::PositionSecondOrderStep2::get_profile(local_e48);
                  }
                }
                else {
                  pdVar35 = (inp->max_velocity).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_cur;
                  lVar32 = (long)pdVar35 -
                           (long)(inp->max_velocity).data.
                                 super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                 super__Deque_impl_data._M_start._M_first >> 3;
                  uVar23 = uVar37 + lVar32;
                  if ((long)uVar23 < 0) {
                    uVar23 = (long)uVar23 >> 6;
LAB_00113f05:
                    pdVar28 = (inp->max_velocity).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_node[uVar23] +
                              lVar32 + uVar23 * -0x40 + uVar37;
                  }
                  else {
                    if (0x3f < uVar23) {
                      uVar23 = uVar23 >> 6;
                      goto LAB_00113f05;
                    }
                    pdVar28 = (double *)((long)pdVar35 + lVar21);
                  }
                  pdVar35 = (inp->max_acceleration).data.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_start._M_cur;
                  lVar32 = (long)pdVar35 -
                           (long)(inp->max_acceleration).data.
                                 super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                 super__Deque_impl_data._M_start._M_first >> 3;
                  uVar23 = uVar37 + lVar32;
                  if ((long)uVar23 < 0) {
                    uVar23 = (long)uVar23 >> 6;
LAB_00113f58:
                    pdVar31 = (inp->max_acceleration).data.
                              super__Deque_base<double,_std::allocator<double>_>._M_impl.
                              super__Deque_impl_data._M_start._M_node[uVar23] +
                              lVar32 + uVar23 * -0x40 + uVar37;
                  }
                  else {
                    if (0x3f < uVar23) {
                      uVar23 = uVar23 >> 6;
                      goto LAB_00113f58;
                    }
                    pdVar31 = (double *)((long)pdVar35 + lVar21);
                  }
                  if ((long)uVar13 < 0) {
LAB_00113f94:
                    pdVar30 = ppdVar5[uVar17] + lVar26 + uVar17 * -0x40 + uVar37;
                  }
                  else {
                    if (0x3f < uVar13) {
                      uVar17 = uVar13 >> 6;
                      goto LAB_00113f94;
                    }
                    pdVar30 = (double *)((long)pdVar14 + lVar21);
                  }
                  ruckig::PositionThirdOrderStep2::PositionThirdOrderStep2
                            ((PositionThirdOrderStep2 *)local_e48,dVar42,(pPVar34->p)._M_elems[0],
                             (pPVar34->v)._M_elems[0],(pPVar34->a)._M_elems[0],pPVar34->pf,
                             pPVar34->vf,pPVar34->af,*pdVar28,
                             (this->inp_min_velocity).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar37],*pdVar31,
                             (this->inp_min_acceleration).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar37],*pdVar30);
                  cVar10 = ruckig::PositionThirdOrderStep2::get_profile(local_e48);
                }
              }
              if (cVar10 == '\0') {
                return ErrorSynchronizationCalculation;
              }
              goto LAB_0011417d;
            }
            pBVar29 = (pointer)((long)&pBVar29[uVar37].b.
                                       super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                       _M_payload + 0x10);
          }
          else {
            pBVar29 = (pointer)((long)&pBVar29[uVar37].a.
                                       super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                       _M_payload + 0x10);
          }
        }
        else {
          pBVar29 = (pointer)((long)(pBVar29->p_min).t._M_elems + lVar19);
        }
      }
      memcpy(pPVar34,pBVar29,0x23c);
    }
LAB_0011417d:
    uVar37 = uVar37 + 1;
    lVar21 = lVar21 + 8;
    lVar19 = lVar19 + 0x6f8;
    lVar18 = lVar18 + 0x240;
    if (this->degrees_of_freedom <= uVar37) {
      return Working;
    }
  } while( true );
}

Assistant:

Result calculate(const InputParameter<DOFs, CustomVector>& inp, Trajectory<DOFs, CustomVector>& traj, double delta_time, bool& was_interrupted) {
        was_interrupted = false;
#if defined WITH_CLOUD_CLIENT
        traj.resize(0);
#endif

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            auto& p = traj.profiles[0][dof];

            inp_min_velocity[dof] = inp.min_velocity ? inp.min_velocity.value()[dof] : -inp.max_velocity[dof];
            inp_min_acceleration[dof] = inp.min_acceleration ? inp.min_acceleration.value()[dof] : -inp.max_acceleration[dof];
            inp_per_dof_control_interface[dof] = inp.per_dof_control_interface ? inp.per_dof_control_interface.value()[dof] : inp.control_interface;
            inp_per_dof_synchronization[dof] = inp.per_dof_synchronization ? inp.per_dof_synchronization.value()[dof] : inp.synchronization;

            if (!inp.enabled[dof]) {
                p.p.back() = inp.current_position[dof];
                p.v.back() = inp.current_velocity[dof];
                p.a.back() = inp.current_acceleration[dof];
                p.t_sum.back() = 0.0;
                blocks[dof].t_min = 0.0;
                blocks[dof].a = std::nullopt;
                blocks[dof].b = std::nullopt;
                continue;
            }

            // Calculate brake (if input exceeds or will exceed limits)
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_position_brake_trajectory(inp.current_velocity[dof], inp.current_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        p.brake.get_second_order_position_brake_trajectory(inp.current_velocity[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                        // p.accel.get_second_order_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                    }
                    p.set_boundary(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_position[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_velocity_brake_trajectory(inp.current_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_velocity_brake_trajectory(inp.target_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else {
                        p.brake.get_second_order_velocity_brake_trajectory();
                        // p.accel.get_second_order_velocity_brake_trajectory();
                    }
                    p.set_boundary_for_velocity(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
            }

            // Finalize pre & post-trajectories
            if (!std::isinf(inp.max_jerk[dof])) {
                p.brake.finalize(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize(p.pf, p.vf, p.af);
            } else if (!std::isinf(inp.max_acceleration[dof])) {
                p.brake.finalize_second_order(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize_second_order(p.pf, p.vf, p.af);
            }

            bool found_profile {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep1 step1 {p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep1 step1 {p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        PositionFirstOrderStep1 step1 {p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep1 step1 {p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        VelocitySecondOrderStep1 step1 {p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
            }

            if (!found_profile) {
                const bool has_zero_limits = (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0);
                if (has_zero_limits) {
                    if constexpr (throw_error) {
                        throw RuckigError("zero limits conflict in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorZeroLimits;
                    }

                } else {
                    if constexpr (throw_error) {
                        throw RuckigError("error in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorExecutionTimeCalculation;
                    }
                }
            }

            traj.independent_min_durations[dof] = blocks[dof].t_min;
            // std::cout << dof << " profile step1: " << blocks[dof].to_string() << std::endl;
        }

        const bool discrete_duration = (inp.duration_discretization == DurationDiscretization::Discrete);
        if (degrees_of_freedom == 1 && !inp.minimum_duration && !discrete_duration) {
            traj.duration = blocks[0].t_min;
            traj.profiles[0][0] = blocks[0].p_min;
            traj.cumulative_times[0] = traj.duration;
            return Result::Working;
        }

        std::optional<size_t> limiting_dof; // The DoF that doesn't need step 2
        const bool found_synchronization = synchronize(inp.minimum_duration, traj.duration, limiting_dof, traj.profiles[0], discrete_duration, delta_time);
        if (!found_synchronization) {
            bool has_zero_limits = false;
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0) {
                    has_zero_limits = true;
                    break;
                }
            }

            if (has_zero_limits) {
                if constexpr (throw_error) {
                    throw RuckigError("zero limits conflict with other degrees of freedom in time synchronization " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorZeroLimits;
                }

            } else {
                if constexpr (throw_error) {
                    throw RuckigError("error in time synchronization: " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
        }

        // None Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp.enabled[dof] && inp_per_dof_synchronization[dof] == Synchronization::None) {
                traj.profiles[0][dof] = blocks[dof].p_min;
                if (blocks[dof].t_min > traj.duration) {
                    traj.duration = blocks[dof].t_min;
                    limiting_dof = dof;
                }
            }
        }
        traj.cumulative_times[0] = traj.duration;

        if constexpr (return_error_at_maximal_duration) {
            if (traj.duration > 7.6e3) {
                return Result::ErrorTrajectoryDuration;
            }
        }

        if (traj.duration == 0.0) {
            // Copy all profiles for end state
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                traj.profiles[0][dof] = blocks[dof].p_min;
            }
            return Result::Working;
        }

        if (!discrete_duration && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::None; })) {
            return Result::Working;
        }

        // Phase Synchronization
        if (limiting_dof && std::any_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase; })) {
            const Profile& p_limiting = traj.profiles[0][limiting_dof.value()];
            if (is_input_collinear(inp, p_limiting.direction, limiting_dof.value())) {
                bool found_time_synchronization {true};
                for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                    if (!inp.enabled[dof] || dof == limiting_dof || inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                        continue;
                    }

                    Profile& p = traj.profiles[0][dof];
                    const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

                    p.t = p_limiting.t; // Copy timing information from limiting DoF
                    p.control_signs = p_limiting.control_signs;

                    // Profile::ReachedLimits::NONE is a small hack, as there is no specialization for that in the check function
                    switch (inp_per_dof_control_interface[dof]) {
                        case ControlInterface::Position: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_first_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                        case ControlInterface::Velocity: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                    }

                    p.limits = p_limiting.limits; // After check method call to set correct limits
                }

                if (found_time_synchronization && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase || s == Synchronization::None; })) {
                    return Result::Working;
                }
            }
        }

        // Time Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const bool skip_synchronization = (dof == limiting_dof || inp_per_dof_synchronization[dof] == Synchronization::None) && !discrete_duration;
            if (!inp.enabled[dof] || skip_synchronization) {
                continue;
            }

            Profile& p = traj.profiles[0][dof];
            const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

            if (inp_per_dof_synchronization[dof] == Synchronization::TimeIfNecessary && std::abs(inp.target_velocity[dof]) < eps && std::abs(inp.target_acceleration[dof]) < eps) {
                p = blocks[dof].p_min;
                continue;
            }

            // Check if the final time corresponds to an extremal profile calculated in step 1
            // Use 2*eps because of numerical robustness in duration discretization
            if (std::abs(t_profile - blocks[dof].t_min) < 2*eps) {
                p = blocks[dof].p_min;
                continue;
            } else if (blocks[dof].a && std::abs(t_profile - blocks[dof].a->right) < 2*eps) {
                p = blocks[dof].a->profile;
                continue;
            } else if (blocks[dof].b && std::abs(t_profile - blocks[dof].b->right) < 2*eps) {
                p = blocks[dof].b->profile;
                continue;
            }

            bool found_time_synchronization {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        PositionFirstOrderStep2 step2 {t_profile, p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep2 step2 {t_profile, p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        VelocitySecondOrderStep2 step2 {t_profile, p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
            }
            if (!found_time_synchronization) {
                if constexpr (throw_error) {
                    throw RuckigError("error in step 2 in dof: " + std::to_string(dof) + " for t sync: " + std::to_string(traj.duration) + " input: " + inp.to_string());
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
            // std::cout << dof << " profile step2: " << p.to_string() << std::endl;
        }

        return Result::Working;
    }